

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::initList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          ElementCount elementCount)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  ulong uVar1;
  ListElementCount LVar2;
  undefined4 in_register_0000000c;
  word *pwVar3;
  uint amount;
  ulong uVar4;
  AllocateResult AVar5;
  anon_class_1_0_00000001 local_4a;
  anon_class_1_0_00000001 local_49;
  ulong local_48;
  StructDataBitCount local_3c;
  ulong local_38;
  
  local_48 = CONCAT44(in_register_0000000c,elementCount);
  ref = this->pointer;
  segment = this->segment;
  AVar5.words = (word *)ref;
  AVar5.segment = segment;
  capTable = this->capTable;
  if (0x1fffffff < elementCount) {
    anon_func::anon_class_1_0_00000001::operator()(&local_4a);
  }
  LVar2 = (ListElementCount)local_48;
  local_3c = *(StructDataBitCount *)((long)&BITS_PER_ELEMENT_TABLE + (ulong)((uint)elementSize * 4))
  ;
  local_38 = (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (uint)elementSize * 4);
  uVar4 = (local_48 & 0xffffffff) * local_38 + 0x3f >> 6;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
    LVar2 = (ListElementCount)local_48;
  }
  pwVar3 = segment->pos;
  uVar1 = uVar4 & 0xffffffff;
  if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
            ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar3)) >> 3 < (long)uVar1) {
    pwVar3 = (word *)0x0;
  }
  else {
    segment->pos = pwVar3 + uVar1;
  }
  if (pwVar3 == (word *)0x0) {
    amount = (int)uVar4 + 1;
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    if (0x1fffffff < amount) {
      WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_49);
    }
    AVar5 = BuilderArena::allocate(this_00,amount);
    (ref->offsetAndKind).value =
         (int)AVar5.words - *(int *)&((AVar5.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar5.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar5.words)->content = 1;
    pwVar3 = AVar5.words + 1;
    LVar2 = (ListElementCount)local_48;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pwVar3 - (long)ref) >> 1) & 0xfffffffc) - 3;
  }
  *(ListElementCount *)((long)&(AVar5.words)->content + 4) = LVar2 * 8 | (uint)elementSize;
  __return_storage_ptr__->segment = AVar5.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->ptr = (byte *)pwVar3;
  __return_storage_ptr__->elementCount = LVar2;
  __return_storage_ptr__->step = (BitsPerElementN<23>)local_38;
  __return_storage_ptr__->structDataSize = local_3c;
  __return_storage_ptr__->structPointerCount = (ushort)(elementSize == POINTER);
  __return_storage_ptr__->elementSize = elementSize;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initList(ElementSize elementSize, ElementCount elementCount) {
  return WireHelpers::initListPointer(pointer, segment, capTable, elementCount, elementSize);
}